

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::WebSocketImpl::ZlibContext::reset(ZlibContext *this)

{
  Fault f;
  DebugComparison<int,_int> _kjCondition;
  
  if (this->mode == DECOMPRESS) {
    _kjCondition.left = inflateReset(&this->ctx);
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == 0;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[21]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd0e,FAILED,"inflateReset(&ctx) == Z_OK","_kjCondition,\"inflateReset failed.\"",
                 &_kjCondition,(char (*) [21])"inflateReset failed.");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else if (this->mode == COMPRESS) {
    _kjCondition.left = deflateReset(&this->ctx);
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == 0;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[23]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd0a,FAILED,"deflateReset(&ctx) == Z_OK",
                 "_kjCondition,\"deflateReset() failed.\"",&_kjCondition,
                 (char (*) [23])"deflateReset() failed.");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  return;
}

Assistant:

void reset() {
      // Resets the (de)compression context. This should only be called when the (de)compressor uses
      // client/server_no_context_takeover.
      switch (mode) {
        case Mode::COMPRESS: {
          KJ_ASSERT(deflateReset(&ctx) == Z_OK, "deflateReset() failed.");
          break;
        }
        case Mode::DECOMPRESS: {
          KJ_ASSERT(inflateReset(&ctx) == Z_OK, "inflateReset failed.");
          break;
        }
      }

    }